

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int get_drl_refmv_count(MACROBLOCK *x,MV_REFERENCE_FRAME *ref_frame,PREDICTION_MODE mode)

{
  byte bVar1;
  int8_t iVar2;
  int iVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  
  iVar2 = av1_ref_frame_type(ref_frame);
  uVar4 = (uint)CONCAT71(in_register_00000011,mode);
  if ((uVar4 < 0x16) && ((0x244000U >> (uVar4 & 0x1f) & 1) != 0)) {
    uVar4 = 1;
  }
  else {
    uVar4 = (uint)(mode == '\x16');
  }
  bVar1 = (x->mbmi_ext).ref_mv_count[iVar2];
  if ((((byte)uVar4 & 2 < bVar1) == 0) && (((mode & 0xf7) != 0x10 || (bVar1 < 2)))) {
    iVar3 = 1;
  }
  else {
    iVar3 = 3;
    if ((int)(bVar1 - uVar4) < 3) {
      iVar3 = bVar1 - uVar4;
    }
  }
  return iVar3;
}

Assistant:

static int get_drl_refmv_count(const MACROBLOCK *const x,
                               const MV_REFERENCE_FRAME *ref_frame,
                               PREDICTION_MODE mode) {
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const int8_t ref_frame_type = av1_ref_frame_type(ref_frame);
  const int has_nearmv = have_nearmv_in_inter_mode(mode) ? 1 : 0;
  const int ref_mv_count = mbmi_ext->ref_mv_count[ref_frame_type];
  const int only_newmv = (mode == NEWMV || mode == NEW_NEWMV);
  const int has_drl =
      (has_nearmv && ref_mv_count > 2) || (only_newmv && ref_mv_count > 1);
  const int ref_set =
      has_drl ? AOMMIN(MAX_REF_MV_SEARCH, ref_mv_count - has_nearmv) : 1;

  return ref_set;
}